

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O2

int build_tree(int *parent,uint16_t *kid_count,size_t source_count,int offset)

{
  int iVar1;
  uint16_t uVar2;
  size_t source_count_00;
  int iVar3;
  uint uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  if (source_count == 1) {
    uVar2 = 0;
    iVar3 = offset;
  }
  else {
    auVar6._8_4_ = (int)(source_count >> 0x20);
    auVar6._0_8_ = source_count;
    auVar6._12_4_ = 0x45300000;
    dVar5 = log((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)source_count) - 4503599627370496.0));
    dVar5 = floor(dVar5 / 0.6931471805599453);
    uVar4 = -1 << ((byte)(int)dVar5 & 0x1f);
    iVar1 = build_tree(parent,kid_count,(ulong)~uVar4,offset);
    iVar3 = ~uVar4 + offset;
    parent[iVar1] = iVar3;
    source_count_00 = ((ulong)uVar4 | 0xffffffff00000000) + source_count;
    if (source_count_00 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = build_tree(parent,kid_count,source_count_00,offset - uVar4);
      parent[iVar1] = iVar3;
      uVar2 = 2;
    }
  }
  kid_count[iVar3] = uVar2;
  return iVar3;
}

Assistant:

int build_tree(int* parent, uint16_t* kid_count, size_t source_count, int offset)
{
  if (source_count == 1)
  {
    kid_count[offset] = 0;
    return offset;
  }

  int height = (int)floor(log((double)source_count) / log(2.0));
  int root = (1 << height) - 1;
  int left_count = root;
  int left_offset = offset;
  int left_child = build_tree(parent, kid_count, left_count, left_offset);
  int oroot = root + offset;
  parent[left_child] = oroot;

  size_t right_count = source_count - left_count - 1;
  if (right_count > 0)
  {
    int right_offset = oroot + 1;

    int right_child = build_tree(parent, kid_count, right_count, right_offset);
    parent[right_child] = oroot;
    kid_count[oroot] = 2;
  }
  else
    kid_count[oroot] = 1;

  return oroot;
}